

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-order.c
# Opt level: O2

void check_cb(uv_check_t *handle)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  iVar1 = uv_check_stop(&check_handle);
  if (iVar1 == 0) {
    iVar1 = uv_timer_stop(&timer_handle);
    if (iVar1 == 0) {
      iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
      if (iVar1 == 0) {
        iVar1 = uv_prepare_start(&prepare_handle,prepare_cb);
        if (iVar1 == 0) {
          if (prepare_cb_called == '\x01') {
            pcVar2 = "0 == prepare_cb_called";
            uStack_10 = 0x39;
          }
          else if (check_cb_called == '\x01') {
            pcVar2 = "0 == check_cb_called";
            uStack_10 = 0x3a;
          }
          else {
            if (timer_cb_called != '\x01') {
              check_cb_called = 1;
              return;
            }
            pcVar2 = "0 == timer_cb_called";
            uStack_10 = 0x3b;
          }
        }
        else {
          pcVar2 = "0 == uv_prepare_start(&prepare_handle, prepare_cb)";
          uStack_10 = 0x38;
        }
      }
      else {
        pcVar2 = "0 == uv_timer_start(&timer_handle, timer_cb, 50, 0)";
        uStack_10 = 0x37;
      }
    }
    else {
      pcVar2 = "0 == uv_timer_stop(&timer_handle)";
      uStack_10 = 0x36;
    }
  }
  else {
    pcVar2 = "0 == uv_check_stop(&check_handle)";
    uStack_10 = 0x35;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-from-check.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

static void check_cb(uv_check_t* handle) {
  ASSERT(check_cb_called == 0);
  ASSERT(timer_cb_called == 1);
  ASSERT(close_cb_called == 0);
  uv_close((uv_handle_t*) handle, close_cb);
  uv_close((uv_handle_t*) &timer_handle2, close_cb);
  check_cb_called++;
}